

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

wstring * __thiscall
mjs::(anonymous_namespace)::json_quote_abi_cxx11_
          (wstring *__return_storage_ptr__,_anonymous_namespace_ *this,wstring_view *s)

{
  int iVar1;
  long lVar2;
  long lVar3;
  wchar_t wVar4;
  long lVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  wVar4 = (wchar_t)__return_storage_ptr__;
  std::__cxx11::wstring::push_back(wVar4);
  lVar2 = *(long *)this;
  lVar3 = *(long *)(this + 8);
  for (lVar5 = 0; lVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
    iVar1 = *(int *)(lVar3 + lVar5);
    if ((iVar1 == 0x5c) || (iVar1 == 0x22)) {
      std::__cxx11::wstring::push_back(wVar4);
    }
    else if (iVar1 < 0x20) {
      std::__cxx11::wstring::push_back(wVar4);
      if ((5 < iVar1 - 8U) || ((0x37U >> (iVar1 - 8U & 0x1f) & 1) == 0)) {
        std::__cxx11::wstring::push_back(wVar4);
        std::__cxx11::wstring::push_back(wVar4);
        std::__cxx11::wstring::push_back(wVar4);
        std::__cxx11::wstring::push_back(wVar4);
      }
    }
    std::__cxx11::wstring::push_back(wVar4);
  }
  std::__cxx11::wstring::push_back(wVar4);
  return __return_storage_ptr__;
}

Assistant:

std::wstring json_quote(const std::wstring_view& s) {
    std::wstring res;
    res.push_back('"');
    for (const auto ch: s) {
        if (ch == '"' || ch == '\\') {
            res.push_back('\\');
            res.push_back(ch);
        } else if (ch < ' ') {
            res.push_back('\\');
            switch (ch) {
            case  8: res.push_back('b'); break;
            case  9: res.push_back('t'); break;
            case 10: res.push_back('n'); break;
            case 12: res.push_back('f'); break;
            case 13: res.push_back('r'); break;
            default:
                res.push_back('u');
                res.push_back('0');
                res.push_back('0');
                res.push_back((ch&0x10)?'1':'0');
                res.push_back("0123456789abcdef"[ch&0xf]);
            }
        } else {
            res.push_back(ch);
        }
    }
    res.push_back('"');
    return res;
}